

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O2

void __thiscall efsw::FileWatcherInotify::run(FileWatcherInotify *this)

{
  _Rb_tree_header *p_Var1;
  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  Mutex *this_01;
  int *piVar2;
  uint uVar3;
  _Base_ptr p_Var4;
  pointer ppVar5;
  Watcher *pWVar6;
  WatcherInotify **ppWVar7;
  pointer ppWVar8;
  uint __i;
  int iVar9;
  long lVar10;
  ssize_t sVar11;
  iterator iVar12;
  Watcher *pWVar13;
  pointer ppVar14;
  pointer ppWVar15;
  pointer ppVar16;
  WatcherInotify *pWVar17;
  int local_264;
  _Base_ptr local_258;
  uint local_244;
  Lock lock;
  _Alloc_hider local_238;
  void *local_230;
  void *local_218;
  pointer local_210;
  vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_> eraseWatches;
  Watcher *oldWatch;
  Lock lock_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  movedOutsideWatches;
  timeval timeout;
  string prevOldFileName;
  string local_150;
  string local_130 [32];
  string local_110;
  string local_f0 [32];
  string local_d0 [32];
  fd_set rfds;
  
  local_218 = operator_new__(0x404000);
  local_258 = (_Base_ptr)0x0;
  memset(local_218,0,0x404000);
  prevOldFileName._M_dataplus._M_p = (pointer)&prevOldFileName.field_2;
  prevOldFileName._M_string_length = 0;
  prevOldFileName.field_2._M_local_buf[0] = '\0';
  this_00 = &this->mMovedOutsideWatches;
  this_01 = &this->mWatchesLock;
  p_Var1 = &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
  iVar12._M_node = (_Base_ptr)0x0;
  local_244 = 0;
  local_264 = -1;
  do {
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      rfds.fds_bits[lVar10] = 0;
    }
    rfds.fds_bits[this->mFD / 0x40] =
         rfds.fds_bits[this->mFD / 0x40] | 1L << ((byte)this->mFD & 0x3f);
    timeout.tv_sec = 0;
    timeout.tv_usec = 100000;
    iVar9 = select(0x400,(fd_set *)&rfds,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&timeout);
    if (iVar9 < 1) {
      if (local_258 != (_Base_ptr)0x0) {
        lock.mMutex = (Mutex *)local_258;
        std::__cxx11::string::string((string *)&local_238,(string *)(local_258 + 2));
        std::
        vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
        ::emplace_back<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>
                  ((vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
                    *)this_00,
                   (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&lock);
        std::__cxx11::string::~string((string *)&local_238);
      }
      local_258 = (_Base_ptr)0x0;
      local_264 = -1;
    }
    else {
      sVar11 = read(this->mFD,local_218,0x404000);
      if (sVar11 != -1) {
        ppVar16 = (pointer)0x0;
        while ((long)ppVar16 < sVar11) {
          lock.mMutex = this_01;
          Mutex::lock(this_01);
          piVar2 = (int *)((long)local_218 + (long)ppVar16);
          local_1c0._M_dataplus._M_p = (pointer)(long)*piVar2;
          iVar12 = std::
                   _Rb_tree<long,_std::pair<const_long,_efsw::WatcherInotify_*>,_std::_Select1st<std::pair<const_long,_efsw::WatcherInotify_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
                   ::find(&(this->mWatches)._M_t,(key_type *)&local_1c0);
          Lock::~Lock(&lock);
          local_210 = ppVar16;
          if ((_Rb_tree_header *)iVar12._M_node != p_Var1) {
            p_Var4 = iVar12._M_node[1]._M_parent;
            std::__cxx11::string::string
                      ((string *)&lock,(char *)(piVar2 + 4),(allocator *)&local_1c0);
            uVar3 = piVar2[1];
            std::__cxx11::string::string(local_d0,"",(allocator *)&movedOutsideWatches);
            (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[6])
                      (this,p_Var4,
                       (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&lock,(ulong)uVar3,local_d0);
            std::__cxx11::string::~string(local_d0);
            std::__cxx11::string::~string((string *)&lock);
            if ((((char)piVar2[1] < '\0') && (iVar12._M_node[1]._M_parent == local_258)) &&
               (piVar2[2] == local_264)) {
              local_258 = (_Base_ptr)0x0;
              local_264 = -1;
            }
            else if ((piVar2[1] & 0x40U) == 0) {
              if (local_258 != (_Base_ptr)0x0) {
                lock.mMutex = (Mutex *)local_258;
                std::__cxx11::string::string((string *)&local_238,(string *)&prevOldFileName);
                std::
                vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
                ::emplace_back<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>
                          ((vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
                            *)this_00,
                           (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&lock);
                std::__cxx11::string::~string((string *)&local_238);
              }
              local_258 = (_Base_ptr)0x0;
              local_264 = -1;
            }
            else {
              if (((byte)local_244 & local_258 != (_Base_ptr)0x0) == 1) {
                lock.mMutex = (Mutex *)local_258;
                std::__cxx11::string::string((string *)&local_238,(string *)&prevOldFileName);
                std::
                vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
                ::emplace_back<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>
                          ((vector<std::pair<efsw::WatcherInotify*,std::__cxx11::string>,std::allocator<std::pair<efsw::WatcherInotify*,std::__cxx11::string>>>
                            *)this_00,
                           (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&lock);
                std::__cxx11::string::~string((string *)&local_238);
              }
              local_258 = iVar12._M_node[1]._M_parent;
              local_264 = piVar2[2];
            }
          }
          uVar3 = piVar2[1];
          if ((uVar3 & 0x40) != 0) {
            std::__cxx11::string::string
                      ((string *)&lock,(char *)(piVar2 + 4),(allocator *)&local_1c0);
            std::__cxx11::string::operator=((string *)&prevOldFileName,(string *)&lock);
            std::__cxx11::string::~string((string *)&lock);
          }
          local_244 = (uVar3 & 0x40) >> 6;
          ppVar16 = (pointer)((long)&(local_210->second)._M_string_length + (ulong)(uint)piVar2[3]);
        }
      }
    }
    if ((this->mMovedOutsideWatches).
        super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->mMovedOutsideWatches).
        super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&movedOutsideWatches,this_00);
      for (ppVar16 = movedOutsideWatches.
                     super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVar16 !=
          movedOutsideWatches.
          super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppVar16 = ppVar16 + 1) {
        ppVar14 = (this->mMovedOutsideWatches).
                  super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar5 = (this->mMovedOutsideWatches).
                 super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((long)ppVar5 - (long)ppVar14 ==
            (long)movedOutsideWatches.
                  super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)movedOutsideWatches.
                  super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          pWVar17 = ppVar16->first;
        }
        else {
          do {
            if (ppVar14 == ppVar5) goto LAB_0010bb85;
            pWVar17 = ppVar16->first;
            ppWVar7 = &ppVar14->first;
            ppVar14 = ppVar14 + 1;
          } while (*ppWVar7 != pWVar17);
        }
        eraseWatches.super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        eraseWatches.super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        eraseWatches.super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lock_1.mMutex = this_01;
        Mutex::lock(this_01);
        local_210 = ppVar16;
        for (; (_Rb_tree_header *)iVar12._M_node != p_Var1;
            iVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar12._M_node)) {
          oldWatch = (Watcher *)iVar12._M_node[1]._M_parent;
          if ((WatcherInotify *)oldWatch != pWVar17) {
            std::operator+(&local_1c0,&(pWVar17->super_Watcher).Directory,&ppVar16->second);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &lock,&local_1c0,"/");
            iVar9 = String::strStartsWith((string *)&lock,&oldWatch->Directory);
            std::__cxx11::string::~string((string *)&lock);
            std::__cxx11::string::~string((string *)&local_1c0);
            if (iVar9 != -1) {
              std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>::push_back
                        (&eraseWatches,&oldWatch);
            }
          }
        }
        Lock::~Lock(&lock_1);
        ppWVar8 = eraseWatches.super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppWVar15 = eraseWatches.
                   super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if (eraseWatches.super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            eraseWatches.super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<efsw::Watcher_**,_std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>_>,_efsw::Watcher_*>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<efsw::Watcher_**,_std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>_>,_efsw::Watcher_*>
                               *)&lock,(__normal_iterator<efsw::Watcher_**,_std::vector<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>_>
                                        )eraseWatches.
                                         super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                              (((long)eraseWatches.
                                      super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)eraseWatches.
                                      super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) + 1) / 2);
          if (local_230 == (void *)0x0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<efsw::Watcher**,std::vector<efsw::Watcher*,std::allocator<efsw::Watcher*>>>,__gnu_cxx::__ops::_Iter_comp_iter<efsw::FileWatcherInotify::run()::__0>>
                      (ppWVar15,ppWVar8);
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<efsw::Watcher**,std::vector<efsw::Watcher*,std::allocator<efsw::Watcher*>>>,efsw::Watcher**,long,__gnu_cxx::__ops::_Iter_comp_iter<efsw::FileWatcherInotify::run()::__0>>
                      (ppWVar15,ppWVar8,local_230,local_238._M_p);
          }
          operator_delete(local_230);
        }
        ppWVar15 = eraseWatches.
                   super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (eraseWatches.super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            eraseWatches.super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string(local_f0,"",(allocator *)&lock);
          (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[6])
                    (this,pWVar17,&ppVar16->second,0x200,local_f0);
          std::__cxx11::string::~string(local_f0);
        }
        else {
          for (; ppWVar15 !=
                 eraseWatches.super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppWVar15 = ppWVar15 + -1) {
            pWVar6 = ppWVar15[-1];
            std::__cxx11::string::string((string *)&local_110,(string *)&pWVar6->Directory);
            pWVar13 = watcherContainsDirectory(this,&local_110);
            std::__cxx11::string::~string((string *)&local_110);
            if (pWVar13 != (Watcher *)0x0) {
              std::__cxx11::string::string((string *)&local_150,(string *)&pWVar6->Directory);
              FileSystem::fileNameFromPath((string *)&lock,&local_150);
              std::__cxx11::string::string(local_130,"",(allocator *)&local_1c0);
              (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[6])
                        (this,pWVar13,
                         (pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&lock,0x200,local_130);
              std::__cxx11::string::~string(local_130);
              std::__cxx11::string::~string((string *)&lock);
              std::__cxx11::string::~string((string *)&local_150);
            }
          }
        }
        std::_Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>::~_Vector_base
                  (&eraseWatches.
                    super__Vector_base<efsw::Watcher_*,_std::allocator<efsw::Watcher_*>_>);
        ppVar16 = local_210;
LAB_0010bb85:
      }
      std::
      vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear(this_00);
      std::
      vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&movedOutsideWatches);
    }
    if (((this->super_FileWatcherImpl).mInitOK.set_._M_base._M_i & 1U) == 0) {
      operator_delete__(local_218);
      std::__cxx11::string::~string((string *)&prevOldFileName);
      return;
    }
  } while( true );
}

Assistant:

void FileWatcherInotify::run() {
	char* buff = new char[BUFF_SIZE];
	memset( buff, 0, BUFF_SIZE );
	WatchMap::iterator wit;

	WatcherInotify* currentMoveFrom = NULL;
	u_int32_t currentMoveCookie = -1;
	bool lastWasMovedFrom = false;
	std::string prevOldFileName;

	do {
		fd_set rfds;
		FD_ZERO( &rfds );
		FD_SET( mFD, &rfds );
		timeval timeout;
		timeout.tv_sec = 0;
		timeout.tv_usec = 100000;

		if ( select( FD_SETSIZE, &rfds, NULL, NULL, &timeout ) > 0 ) {
			ssize_t len;

			len = read( mFD, buff, BUFF_SIZE );

			if ( len != -1 ) {
				ssize_t i = 0;

				while ( i < len ) {
					struct inotify_event* pevent = (struct inotify_event*)&buff[i];

					{
						{
							Lock lock( mWatchesLock );

							wit = mWatches.find( pevent->wd );
						}

						if ( wit != mWatches.end() ) {
							handleAction( wit->second, (char*)pevent->name, pevent->mask );

							if ( ( pevent->mask & IN_MOVED_TO ) && wit->second == currentMoveFrom &&
								 pevent->cookie == currentMoveCookie ) {
								/// make pair success
								currentMoveFrom = NULL;
								currentMoveCookie = -1;
							} else if ( pevent->mask & IN_MOVED_FROM ) {
								// Previous event was moved from and current event is moved from
								// Treat it as a DELETE or moved ouside watches
								if ( lastWasMovedFrom && currentMoveFrom ) {
									mMovedOutsideWatches.push_back(
										std::make_pair( currentMoveFrom, prevOldFileName ) );
								}

								currentMoveFrom = wit->second;
								currentMoveCookie = pevent->cookie;
							} else {
								/// Keep track of the IN_MOVED_FROM events to know
								/// if the IN_MOVED_TO event is also fired
								if ( currentMoveFrom ) {
									mMovedOutsideWatches.push_back(
										std::make_pair( currentMoveFrom, prevOldFileName ) );
								}

								currentMoveFrom = NULL;
								currentMoveCookie = -1;
							}
						}

						lastWasMovedFrom = ( pevent->mask & IN_MOVED_FROM ) != 0;
						if ( pevent->mask & IN_MOVED_FROM )
							prevOldFileName = std::string( (char*)pevent->name );
					}

					i += sizeof( struct inotify_event ) + pevent->len;
				}
			}
		} else {
			// Here means no event received
			// If last event is IN_MOVED_FROM, we assume no IN_MOVED_TO
			if ( currentMoveFrom ) {
				mMovedOutsideWatches.push_back(
					std::make_pair( currentMoveFrom, currentMoveFrom->OldFileName ) );
			}

			currentMoveFrom = NULL;
			currentMoveCookie = -1;
		}

		if ( !mMovedOutsideWatches.empty() ) {
			// We need to make a copy since the element mMovedOutsideWatches could be modified
			// during the iteration.
			std::vector<std::pair<WatcherInotify*, std::string>> movedOutsideWatches(
				mMovedOutsideWatches );

			/// In case that the IN_MOVED_TO is never fired means that the file was moved to other
			/// folder
			for ( std::vector<std::pair<WatcherInotify*, std::string>>::iterator it =
					  movedOutsideWatches.begin();
				  it != movedOutsideWatches.end(); ++it ) {

				// Skip if the watch has already being removed
				if ( mMovedOutsideWatches.size() != movedOutsideWatches.size() ) {
					bool found = false;
					for ( std::vector<std::pair<WatcherInotify*, std::string>>::iterator itm =
							  mMovedOutsideWatches.begin();
						  mMovedOutsideWatches.end() != itm; ++itm ) {
						if ( itm->first == it->first ) {
							found = true;
							break;
						}
					}
					if ( !found )
						continue;
				}

				Watcher* watch = ( *it ).first;
				const std::string& oldFileName = ( *it ).second;

				/// Check if the file move was a folder already being watched
				std::vector<Watcher*> eraseWatches;

				{
					Lock lock( mWatchesLock );

					for ( ; wit != mWatches.end(); ++wit ) {
						Watcher* oldWatch = wit->second;

						if ( oldWatch != watch &&
							 -1 != String::strStartsWith( watch->Directory + oldFileName + "/",
														  oldWatch->Directory ) ) {
							eraseWatches.push_back( oldWatch );
						}
					}
				}

				/// Remove invalid watches
				std::stable_sort( eraseWatches.begin(), eraseWatches.end(),
								  []( const Watcher* left, const Watcher* right ) {
									  return left->Directory < right->Directory;
								  } );

				if ( eraseWatches.empty() ) {
					handleAction( watch, oldFileName, IN_DELETE );
				} else {
					for ( std::vector<Watcher*>::reverse_iterator eit = eraseWatches.rbegin();
						  eit != eraseWatches.rend(); ++eit ) {
						Watcher* rmWatch = *eit;

						/// Create Delete event for removed watches that have been moved too
						if ( Watcher* cntWatch = watcherContainsDirectory( rmWatch->Directory ) ) {
							handleAction( cntWatch,
										  FileSystem::fileNameFromPath( rmWatch->Directory ),
										  IN_DELETE );
						}
					}
				}
			}

			mMovedOutsideWatches.clear();
		}
	} while ( mInitOK );

	delete[] buff;
}